

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnElemDrop(SharedValidator *this,Location *loc,Var *segment_var)

{
  Result rhs;
  char *pcVar1;
  int __c;
  Var local_78;
  Enum local_30;
  Opcode local_2c;
  Var *local_28;
  Var *segment_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_28 = segment_var;
  segment_var_local = (Var *)loc;
  loc_local = (Location *)this;
  Opcode::Opcode(&local_2c,ElemDrop);
  this_local._4_4_ = CheckInstr(this,local_2c,&segment_var_local->loc);
  Var::Var(&local_78,segment_var);
  local_30 = (Enum)CheckElemSegmentIndex(this,&local_78,(ElemType *)0x0);
  pcVar1 = (char *)(ulong)local_30;
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_30);
  Var::~Var(&local_78);
  pcVar1 = Var::index(segment_var,pcVar1,__c);
  rhs = TypeChecker::OnElemDrop(&this->typechecker_,(uint32_t)pcVar1);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnElemDrop(const Location& loc, Var segment_var) {
  Result result = CheckInstr(Opcode::ElemDrop, loc);
  result |= CheckElemSegmentIndex(segment_var);
  result |= typechecker_.OnElemDrop(segment_var.index());
  return result;
}